

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

float __thiscall Imath_3_2::Matrix44<float>::determinant(Matrix44<float> *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = this->x[0][3];
  fVar2 = 0.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar2 = fastMinor(this,1,2,3,0,1,2);
    fVar2 = 0.0 - fVar1 * fVar2;
  }
  fVar1 = this->x[1][3];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar3 = fastMinor(this,0,2,3,0,1,2);
    fVar2 = fVar2 + fVar1 * fVar3;
  }
  fVar1 = this->x[2][3];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar3 = fastMinor(this,0,1,3,0,1,2);
    fVar2 = fVar2 - fVar1 * fVar3;
  }
  fVar1 = this->x[3][3];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar3 = fastMinor(this,0,1,2,0,1,2);
    fVar2 = fVar3 * fVar1 + fVar2;
  }
  return fVar2;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Matrix44<T>::determinant () const IMATH_NOEXCEPT
{
    T sum = (T) 0;

    if (x[0][3] != 0.) sum -= x[0][3] * fastMinor (1, 2, 3, 0, 1, 2);
    if (x[1][3] != 0.) sum += x[1][3] * fastMinor (0, 2, 3, 0, 1, 2);
    if (x[2][3] != 0.) sum -= x[2][3] * fastMinor (0, 1, 3, 0, 1, 2);
    if (x[3][3] != 0.) sum += x[3][3] * fastMinor (0, 1, 2, 0, 1, 2);

    return sum;
}